

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O3

int CVmFormatter::wtoi(wchar_t *p)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  wchar_t *pwVar5;
  wchar_t *pwVar6;
  
  do {
    pwVar5 = p;
    uVar3 = t3_get_chartype(*pwVar5);
    p = pwVar5 + 1;
  } while ((uVar3 & 0xfffffffe) == 6);
  pwVar6 = p;
  if ((*pwVar5 == L'+') || (pwVar6 = pwVar5, *pwVar5 != L'-')) {
    bVar2 = true;
  }
  else {
    bVar2 = false;
    pwVar6 = p;
  }
  uVar3 = *pwVar6 + L'\xffffffd0';
  iVar4 = 0;
  if (uVar3 < 10) {
    iVar4 = 0;
    do {
      pwVar6 = pwVar6 + 1;
      iVar4 = uVar3 + iVar4 * 10;
      uVar3 = *pwVar6 + L'\xffffffd0';
    } while (uVar3 < 10);
  }
  iVar1 = -iVar4;
  if (bVar2) {
    iVar1 = iVar4;
  }
  return iVar1;
}

Assistant:

int CVmFormatter::wtoi(const wchar_t *p)
{
    long acc;
    int neg = FALSE;

    /* skip any leading whitespace */
    while (t3_is_whitespace(*p))
        ++p;

    /* check for a leading sign */
    if (*p == '+')
    {
        /* positive sign - skip it */
        ++p;
    }
    else if (*p == '-')
    {
        /* negative sign - note it and skip it */
        neg = TRUE;
        ++p;
    }

    /* scan the digits */
    for (acc = 0 ; is_digit(*p) ; ++p)
    {
        /* shift the accumulator and add this digit */
        acc *= 10;
        acc += value_of_digit(*p);
    }

    /* apply the sign */
    if (neg)
        acc = -acc;

    /* return the result */
    return acc;
}